

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveEntityReliablePdu.cpp
# Opt level: O0

void __thiscall DIS::RemoveEntityReliablePdu::RemoveEntityReliablePdu(RemoveEntityReliablePdu *this)

{
  RemoveEntityReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__RemoveEntityReliablePdu_00272e00;
  this->_requiredReliabilityService = '\0';
  this->_pad1 = 0;
  this->_pad2 = '\0';
  this->_requestID = 0;
  Pdu::setPduType((Pdu *)this,'4');
  return;
}

Assistant:

RemoveEntityReliablePdu::RemoveEntityReliablePdu() : SimulationManagementWithReliabilityFamilyPdu(),
   _requiredReliabilityService(0), 
   _pad1(0), 
   _pad2(0), 
   _requestID(0)
{
    setPduType( 52 );
}